

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O2

void __thiscall Assimp::XFileExporter::WriteFrameTransform(XFileExporter *this,aiMatrix4x4 *m)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  ostream *poVar4;
  
  puVar1 = &this->field_0x18;
  psVar2 = &this->startstr;
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"FrameTransformMatrix {");
  psVar3 = &this->endstr;
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  std::operator<<(poVar4," ");
  PushTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->a1);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->b1);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->c1);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->d1);
  poVar4 = std::operator<<(poVar4,",");
  std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->a2);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->b2);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->c2);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->d2);
  poVar4 = std::operator<<(poVar4,",");
  std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->a3);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->b3);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->c3);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->d3);
  poVar4 = std::operator<<(poVar4,",");
  std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->a4);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->b4);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->c4);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,m->d4);
  poVar4 = std::operator<<(poVar4,";;");
  std::operator<<(poVar4,(string *)psVar3);
  PopTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  std::operator<<(poVar4,(string *)psVar3);
  return;
}

Assistant:

void XFileExporter::WriteFrameTransform(aiMatrix4x4& m)
{
    mOutput << startstr << "FrameTransformMatrix {" << endstr << " ";
    PushTag();
    mOutput << startstr << m.a1 << ", " << m.b1 << ", " << m.c1 << ", " << m.d1 << "," << endstr;
    mOutput << startstr << m.a2 << ", " << m.b2 << ", " << m.c2 << ", " << m.d2 << "," << endstr;
    mOutput << startstr << m.a3 << ", " << m.b3 << ", " << m.c3 << ", " << m.d3 << "," << endstr;
    mOutput << startstr << m.a4 << ", " << m.b4 << ", " << m.c4 << ", " << m.d4 << ";;" << endstr;
    PopTag();
    mOutput << startstr << "}" << endstr << endstr;
}